

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

dynamic_string * __thiscall crnlib::dynamic_string::tail(dynamic_string *this,uint num)

{
  uint uVar1;
  uint end;
  dynamic_string *pdVar2;
  uint num_local;
  dynamic_string *this_local;
  
  uVar1 = get_len(this);
  uVar1 = math::maximum<int>(uVar1 - num,0);
  end = get_len(this);
  pdVar2 = substring(this,uVar1,end);
  return pdVar2;
}

Assistant:

dynamic_string& dynamic_string::tail(uint num)
    {
        return substring(math::maximum<int>(static_cast<int>(get_len()) - static_cast<int>(num), 0), get_len());
    }